

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O1

void skill_help(int *r_skills,int *c_skills,wchar_t mhp,wchar_t infra)

{
  uint i;
  long lVar1;
  short sVar2;
  short sVar3;
  int16_t skills [10];
  short local_28 [16];
  
  lVar1 = 0;
  do {
    sVar2 = 0;
    if (r_skills != (int *)0x0) {
      sVar2 = (short)r_skills[lVar1];
    }
    if (c_skills == (int *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (short)c_skills[lVar1];
    }
    local_28[lVar1] = sVar3 + sVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  text_out_e("Hit/Shoot/Throw: %+d/%+d/%+d  Hit die: %2d\n",(ulong)(uint)(int)local_28[6],
             (ulong)(uint)(int)local_28[7],(ulong)(uint)(int)local_28[8],(ulong)(uint)mhp);
  text_out_e("Disarm: %+3d/%+3d   Devices: %+3d\n",(ulong)(uint)(int)local_28[0],
             (ulong)(uint)(int)local_28[1],(ulong)(uint)(int)local_28[2]);
  text_out_e("Save:       %+3d   Stealth: %+3d\n",(ulong)(uint)(int)local_28[3],
             (ulong)(uint)(int)local_28[5]);
  text_out_e("Digging:    %+3d   Search:  %+3d\n",(ulong)(uint)(int)local_28[9],
             (ulong)(uint)(int)local_28[4]);
  if (L'\xffffffff' < infra) {
    text_out_e("Infravision:  %d ft\n",(ulong)(uint)(infra * 10));
    return;
  }
  return;
}

Assistant:

static void skill_help(const int r_skills[], const int c_skills[], int mhp, int infra)
{
	int16_t skills[SKILL_MAX];
	unsigned i;

	for (i = 0; i < SKILL_MAX ; ++i)
		skills[i] = (r_skills ? r_skills[i] : 0 ) + (c_skills ? c_skills[i] : 0);

	text_out_e("Hit/Shoot/Throw: %+d/%+d/%+d  Hit die: %2d\n",
			   skills[SKILL_TO_HIT_MELEE], skills[SKILL_TO_HIT_BOW],
			   skills[SKILL_TO_HIT_THROW], mhp);
	text_out_e("Disarm: %+3d/%+3d   Devices: %+3d\n", skills[SKILL_DISARM_PHYS],
			   skills[SKILL_DISARM_MAGIC], skills[SKILL_DEVICE]);
	text_out_e("Save:       %+3d   Stealth: %+3d\n", skills[SKILL_SAVE],
			   skills[SKILL_STEALTH]);
	text_out_e("Digging:    %+3d   Search:  %+3d\n", skills[SKILL_DIGGING],
			   skills[SKILL_SEARCH]);
	if (infra >= 0)
		text_out_e("Infravision:  %d ft\n", infra * 10);
}